

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O2

LispPTR N_OP_idifference(LispPTR tosm1,LispPTR tos)

{
  ushort uVar1;
  uint uVar2;
  LispPTR LVar3;
  LispPTR *pLVar4;
  float *pfVar5;
  uint *NAddr;
  uint uVar6;
  
  if ((tosm1 & 0xfff0000) == 0xf0000) {
    LVar3 = tosm1 | 0xffff0000;
  }
  else if ((tosm1 & 0xfff0000) == 0xe0000) {
    LVar3 = tosm1 & 0xffff;
  }
  else {
    uVar1 = *(ushort *)((ulong)(tosm1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar1 == 3) {
      pfVar5 = (float *)NativeAligned4FromLAddr(tosm1);
      if (*pfVar5 != 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      LVar3 = (LispPTR)*pfVar5;
    }
    else {
      if (uVar1 != 2) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar4 = NativeAligned4FromLAddr(tosm1);
      LVar3 = *pLVar4;
    }
  }
  if ((tos & 0xfff0000) == 0xf0000) {
    uVar2 = tos | 0xffff0000;
  }
  else if ((tos & 0xfff0000) == 0xe0000) {
    uVar2 = tos & 0xffff;
  }
  else {
    uVar1 = *(ushort *)((ulong)(tos >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar1 == 3) {
      pfVar5 = (float *)NativeAligned4FromLAddr(tos);
      if (*pfVar5 != 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      uVar2 = (uint)*pfVar5;
    }
    else {
      if (uVar1 != 2) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar4 = NativeAligned4FromLAddr(tos);
      uVar2 = *pLVar4;
    }
  }
  uVar6 = LVar3 - uVar2;
  if (SBORROW4(LVar3,uVar2)) {
    MachineState.errorexit = 1;
    MachineState.tosvalue = tos;
    return 0xffffffff;
  }
  if ((uVar6 & 0xffff0000) == 0xffff0000) {
    return uVar6 & 0xffff | 0xf0000;
  }
  if ((uVar6 & 0xffff0000) != 0) {
    NAddr = (uint *)createcell68k(2);
    *NAddr = uVar6;
    LVar3 = LAddrFromNative(NAddr);
    return LVar3;
  }
  return uVar6 | 0xe0000;
}

Assistant:

LispPTR N_OP_idifference(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_IGETNUMBER(tosm1, arg1, doufn);
  N_IGETNUMBER(tos, arg2, doufn);

#ifdef USE_OVERFLOW_BUILTINS

  if (__builtin_ssub_overflow(arg1, arg2, &result)) {
    ERROR_EXIT(tos);
  }
  N_ARITH_SWITCH(result);

#else
  /* UB: signed integer overflow: -2147483647 - 100 cannot be represented in type 'int' */
  result = arg1 - arg2;
  if (((arg1 >= 0) == (arg2 < 0)) && ((result >= 0) != (arg1 >= 0))) { ERROR_EXIT(tos); }
  N_ARITH_SWITCH(result);

#endif
doufn:
  ERROR_EXIT(tos);
}